

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformGradient.cpp
# Opt level: O2

void __thiscall OpenMD::UniformGradient::initialize(UniformGradient *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Globals *pGVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  vector<double,_std::allocator<double>_> d1;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  pGVar7 = this->simParams;
  bVar1 = (pGVar7->UniformGradientDirection1).super_ParameterBase.empty_;
  if (bVar1 == false) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_38,
               &(pGVar7->UniformGradientDirection1).data_);
    if ((long)local_38._M_impl.super__Vector_impl_data._M_finish -
        (long)local_38._M_impl.super__Vector_impl_data._M_start != 0x18) {
      snprintf(painCave.errMsg,2000,
               "uniformGradientDirection1: Incorrect number of parameters\n\tspecified. There should be 3 parameters, but %zu were\n\tspecified.\n"
               ,(long)local_38._M_impl.super__Vector_impl_data._M_finish -
                (long)local_38._M_impl.super__Vector_impl_data._M_start >> 3);
      painCave.isFatal = 1;
      simError();
    }
    (this->a_).super_Vector<double,_3U>.data_[0] =
         *local_38._M_impl.super__Vector_impl_data._M_start;
    (this->a_).super_Vector<double,_3U>.data_[1] =
         local_38._M_impl.super__Vector_impl_data._M_start[1];
    (this->a_).super_Vector<double,_3U>.data_[2] =
         local_38._M_impl.super__Vector_impl_data._M_start[2];
    Vector<double,_3U>::normalize(&(this->a_).super_Vector<double,_3U>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
    pGVar7 = this->simParams;
  }
  bVar2 = (pGVar7->UniformGradientDirection2).super_ParameterBase.empty_;
  if (bVar2 == false) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_38,
               &(pGVar7->UniformGradientDirection2).data_);
    if ((long)local_38._M_impl.super__Vector_impl_data._M_finish -
        (long)local_38._M_impl.super__Vector_impl_data._M_start != 0x18) {
      snprintf(painCave.errMsg,2000,
               "uniformGradientDirection2: Incorrect number of parameters\n\tspecified. There should be 3 parameters, but %zu were\n\tspecified.\n"
               ,(long)local_38._M_impl.super__Vector_impl_data._M_finish -
                (long)local_38._M_impl.super__Vector_impl_data._M_start >> 3);
      painCave.isFatal = 1;
      simError();
    }
    (this->b_).super_Vector<double,_3U>.data_[0] =
         *local_38._M_impl.super__Vector_impl_data._M_start;
    (this->b_).super_Vector<double,_3U>.data_[1] =
         local_38._M_impl.super__Vector_impl_data._M_start[1];
    (this->b_).super_Vector<double,_3U>.data_[2] =
         local_38._M_impl.super__Vector_impl_data._M_start[2];
    Vector<double,_3U>::normalize(&(this->b_).super_Vector<double,_3U>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
    pGVar7 = this->simParams;
  }
  bVar3 = (pGVar7->UniformGradientStrength).super_ParameterBase.empty_;
  if (((bVar3 == false) && (this->g_ = (pGVar7->UniformGradientStrength).data_, bVar1 == false)) &&
     (bVar2 == false)) {
    this->doUniformGradient = true;
    dVar11 = dot<double,3u>(&(this->a_).super_Vector<double,_3U>,
                            &(this->b_).super_Vector<double,_3U>);
    this->cpsi_ = dVar11;
    dVar9 = (this->a_).super_Vector<double,_3U>.data_[0];
    dVar12 = (this->b_).super_Vector<double,_3U>.data_[0];
    dVar11 = dVar11 / -3.0;
    dVar10 = dVar9 * dVar12 + dVar11;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         dVar10 + dVar10;
    dVar10 = (this->b_).super_Vector<double,_3U>.data_[1];
    dVar4 = (this->b_).super_Vector<double,_3U>.data_[2];
    dVar5 = (this->a_).super_Vector<double,_3U>.data_[1];
    dVar6 = (this->a_).super_Vector<double,_3U>.data_[2];
    dVar8 = dVar9 * dVar10 + dVar12 * dVar5;
    dVar9 = dVar9 * dVar4 + dVar12 * dVar6;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = dVar8
    ;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = dVar9
    ;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = dVar8
    ;
    dVar12 = dVar5 * dVar10 + dVar11;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
         dVar12 + dVar12;
    dVar12 = dVar5 * dVar4 + dVar10 * dVar6;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
         dVar12;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = dVar9
    ;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] =
         dVar12;
    dVar11 = dVar4 * dVar6 + dVar11;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
         dVar11 + dVar11;
    RectMatrix<double,_3U,_3U>::mul((RectMatrix<double,_3U,_3U> *)&this->Grad_,this->g_ * 0.5);
  }
  else {
    if (bVar1 != false) {
      builtin_strncpy(painCave.errMsg + 0x20,"Direction1 not specified.\n",0x1b);
      builtin_strncpy(painCave.errMsg + 0x10," uniformGradient",0x10);
      builtin_strncpy(painCave.errMsg,"UniformGradient:",0x10);
      painCave.isFatal = 1;
      simError();
    }
    if (bVar2 != false) {
      builtin_strncpy(painCave.errMsg + 0x20,"Direction2 not specified.\n",0x1b);
      builtin_strncpy(painCave.errMsg + 0x10," uniformGradient",0x10);
      builtin_strncpy(painCave.errMsg,"UniformGradient:",0x10);
      painCave.isFatal = 1;
      simError();
    }
    if (bVar3 != false) {
      builtin_strncpy(painCave.errMsg + 0x20,"Strength not specified.\n",0x19);
      builtin_strncpy(painCave.errMsg + 0x10," uniformGradient",0x10);
      builtin_strncpy(painCave.errMsg,"UniformGradient:",0x10);
      painCave.isFatal = 1;
      simError();
    }
  }
  if ((((this->super_ForceModifier).info_)->sman_->atomStorageLayout_ & 0x40) != 0) {
    this->doParticlePot = true;
  }
  this->initialized = true;
  return;
}

Assistant:

void UniformGradient::initialize() {
    bool haveA = false;
    bool haveB = false;
    bool haveG = false;

    if (simParams->haveUniformGradientDirection1()) {
      std::vector<RealType> d1 = simParams->getUniformGradientDirection1();
      if (d1.size() != 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "uniformGradientDirection1: Incorrect number of parameters\n"
                 "\tspecified. There should be 3 parameters, but %zu were\n"
                 "\tspecified.\n",
                 d1.size());
        painCave.isFatal = 1;
        simError();
      }
      a_.x() = d1[0];
      a_.y() = d1[1];
      a_.z() = d1[2];

      a_.normalize();
      haveA = true;
    }

    if (simParams->haveUniformGradientDirection2()) {
      std::vector<RealType> d2 = simParams->getUniformGradientDirection2();
      if (d2.size() != 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "uniformGradientDirection2: Incorrect number of parameters\n"
                 "\tspecified. There should be 3 parameters, but %zu were\n"
                 "\tspecified.\n",
                 d2.size());
        painCave.isFatal = 1;
        simError();
      }
      b_.x() = d2[0];
      b_.y() = d2[1];
      b_.z() = d2[2];

      b_.normalize();
      haveB = true;
    }

    if (simParams->haveUniformGradientStrength()) {
      g_    = simParams->getUniformGradientStrength();
      haveG = true;
    }

    if (haveA && haveB && haveG) {
      doUniformGradient = true;
      cpsi_             = dot(a_, b_);

      Grad_(0, 0) = 2.0 * (a_.x() * b_.x() - cpsi_ / 3.0);
      Grad_(0, 1) = a_.x() * b_.y() + a_.y() * b_.x();
      Grad_(0, 2) = a_.x() * b_.z() + a_.z() * b_.x();
      Grad_(1, 0) = Grad_(0, 1);
      Grad_(1, 1) = 2.0 * (a_.y() * b_.y() - cpsi_ / 3.0);
      Grad_(1, 2) = a_.y() * b_.z() + a_.z() * b_.y();
      Grad_(2, 0) = Grad_(0, 2);
      Grad_(2, 1) = Grad_(1, 2);
      Grad_(2, 2) = 2.0 * (a_.z() * b_.z() - cpsi_ / 3.0);

      Grad_ *= g_ / 2.0;

    } else {
      if (!haveA) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "UniformGradient: uniformGradientDirection1 not specified.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!haveB) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "UniformGradient: uniformGradientDirection2 not specified.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!haveG) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "UniformGradient: uniformGradientStrength not specified.\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    int storageLayout_ = info_->getSnapshotManager()->getAtomStorageLayout();
    if (storageLayout_ & DataStorage::dslParticlePot) doParticlePot = true;
    initialized = true;
  }